

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteBatch::SetupSQLStatements(SQLiteBatch *this)

{
  initializer_list<std::pair<sqlite3_stmt_**,_const_char_*>_> __l;
  bool bVar1;
  int iVar2;
  type *pppsVar3;
  type *ppcVar4;
  runtime_error *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  int res;
  type *stmt_text;
  type *stmt_prepared;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  statements;
  pair<sqlite3_stmt_**,_const_char_*> *in_stack_fffffffffffffe78;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  *in_stack_fffffffffffffe80;
  pair<sqlite3_stmt_**,_const_char_*> *in_stack_fffffffffffffe88;
  char **args;
  char *fmt;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  *in_stack_fffffffffffffeb8;
  iterator in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  char local_e1;
  char *local_e0;
  long local_d8;
  char *local_d0;
  long local_c8;
  char *local_c0;
  long local_b8;
  char *local_b0;
  long local_a8;
  char *local_a0;
  long local_98;
  string local_78 [32];
  char *local_58 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = in_RDI + 0x18;
  local_a0 = "SELECT value FROM main WHERE key = ?";
  args = local_58;
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffe88,(sqlite3_stmt ***)in_stack_fffffffffffffe80,
             (char **)in_stack_fffffffffffffe78);
  local_a8 = in_RDI + 0x20;
  local_b0 = "INSERT INTO main VALUES(?, ?)";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffe88,(sqlite3_stmt ***)in_stack_fffffffffffffe80,
             (char **)in_stack_fffffffffffffe78);
  local_b8 = in_RDI + 0x28;
  local_c0 = "INSERT or REPLACE into main values(?, ?)";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffe88,(sqlite3_stmt ***)in_stack_fffffffffffffe80,
             (char **)in_stack_fffffffffffffe78);
  local_c8 = in_RDI + 0x30;
  local_d0 = "DELETE FROM main WHERE key = ?";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffe88,(sqlite3_stmt ***)in_stack_fffffffffffffe80,
             (char **)in_stack_fffffffffffffe78);
  local_d8 = in_RDI + 0x38;
  local_e0 = "DELETE FROM main WHERE instr(key, ?) = 1";
  std::pair<sqlite3_stmt_**,_const_char_*>::pair<sqlite3_stmt_**,_true>
            (in_stack_fffffffffffffe88,(sqlite3_stmt ***)in_stack_fffffffffffffe80,
             (char **)in_stack_fffffffffffffe78);
  fmt = &local_e1;
  std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>::allocator
            ((allocator<std::pair<sqlite3_stmt_**,_const_char_*>_> *)in_stack_fffffffffffffe78);
  __l._M_len = in_stack_fffffffffffffec8;
  __l._M_array = in_stack_fffffffffffffec0;
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::vector(in_stack_fffffffffffffeb8,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>::~allocator
            ((allocator<std::pair<sqlite3_stmt_**,_const_char_*>_> *)in_stack_fffffffffffffe78);
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::begin(in_stack_fffffffffffffe80);
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::end(in_stack_fffffffffffffe80);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                      ((__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                        *)in_stack_fffffffffffffe88,
                       (__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                        *)in_stack_fffffffffffffe80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
      ::~vector((vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                 *)in_stack_fffffffffffffe88);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_00b9aa55:
      __stack_chk_fail();
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
    ::operator*((__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                 *)in_stack_fffffffffffffe78);
    pppsVar3 = std::get<0ul,sqlite3_stmt**,char_const*>(in_stack_fffffffffffffe78);
    ppcVar4 = std::get<1ul,sqlite3_stmt**,char_const*>(in_stack_fffffffffffffe78);
    if ((**pppsVar3 == (sqlite3_stmt *)0x0) &&
       (iVar2 = sqlite3_prepare_v2(*(undefined8 *)(*(long *)(in_RDI + 8) + 200),*ppcVar4,0xffffffff,
                                   *pppsVar3,0), iVar2 != 0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      sqlite3_errstr(iVar2);
      tinyformat::format<char_const*>(fmt,args);
      std::runtime_error::runtime_error(this_00,local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00b9aa55;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<sqlite3_stmt_**,_const_char_*>_*,_std::vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>_>
                  *)in_stack_fffffffffffffe78);
  } while( true );
}

Assistant:

void SQLiteBatch::SetupSQLStatements()
{
    const std::vector<std::pair<sqlite3_stmt**, const char*>> statements{
        {&m_read_stmt, "SELECT value FROM main WHERE key = ?"},
        {&m_insert_stmt, "INSERT INTO main VALUES(?, ?)"},
        {&m_overwrite_stmt, "INSERT or REPLACE into main values(?, ?)"},
        {&m_delete_stmt, "DELETE FROM main WHERE key = ?"},
        {&m_delete_prefix_stmt, "DELETE FROM main WHERE instr(key, ?) = 1"},
    };

    for (const auto& [stmt_prepared, stmt_text] : statements) {
        if (*stmt_prepared == nullptr) {
            int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, stmt_prepared, nullptr);
            if (res != SQLITE_OK) {
                throw std::runtime_error(strprintf(
                    "SQLiteDatabase: Failed to setup SQL statements: %s\n", sqlite3_errstr(res)));
            }
        }
    }
}